

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_verify_traces.c
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  char *pcVar5;
  ushort **ppuVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  parasail_function_group_t f;
  parasail_function_group_t f_00;
  parasail_function_group_t f_01;
  parasail_function_group_t f_02;
  parasail_function_group_t f_03;
  parasail_function_group_t f_04;
  parasail_function_group_t f_05;
  parasail_function_group_t f_06;
  parasail_function_group_t f_07;
  parasail_function_group_t f_08;
  parasail_function_group_t f_09;
  parasail_function_group_t f_10;
  parasail_function_group_t f_11;
  parasail_function_group_t f_12;
  parasail_function_group_t f_13;
  parasail_function_group_t f_14;
  parasail_function_group_t f_15;
  parasail_function_group_t f_16;
  parasail_function_group_t f_17;
  parasail_function_group_t f_18;
  parasail_function_group_t f_19;
  parasail_function_group_t f_20;
  parasail_function_group_t f_21;
  parasail_function_group_t f_22;
  parasail_function_group_t f_23;
  parasail_function_group_t f_24;
  parasail_function_group_t f_25;
  parasail_function_group_t f_26;
  parasail_function_group_t f_27;
  parasail_function_group_t f_28;
  parasail_function_group_t f_29;
  parasail_function_group_t f_30;
  parasail_function_group_t f_31;
  parasail_function_group_t f_32;
  parasail_function_group_t f_33;
  parasail_function_group_t f_34;
  parasail_function_group_t f_35;
  parasail_function_group_t f_36;
  parasail_function_group_t f_37;
  parasail_function_group_t f_38;
  parasail_function_group_t f_39;
  parasail_function_group_t f_40;
  parasail_function_group_t f_41;
  parasail_function_group_t f_42;
  parasail_function_group_t f_43;
  parasail_function_group_t f_44;
  parasail_function_group_t f_45;
  parasail_function_group_t f_46;
  parasail_function_group_t f_47;
  parasail_function_group_t f_48;
  parasail_function_group_t f_49;
  parasail_function_group_t f_50;
  int do_sw;
  int do_sg;
  int do_nw;
  int do_disp;
  int do_neon;
  int do_altivec;
  int do_avx2;
  int do_sse41;
  int do_sse2;
  gap_score_t gap;
  parasail_matrix_t *matrix;
  char *matrixname;
  int test_scores;
  int c;
  char *filename;
  char *endptr;
  parasail_sequences_t *sequences;
  unsigned_long limit;
  unsigned_long seq_count;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  limit = 0;
  sequences = (parasail_sequences_t *)0x0;
  endptr = (char *)0x0;
  filename = (char *)0x0;
  _test_scores = (parasail_matrix_t *)0x0;
  bVar1 = true;
  matrix = (parasail_matrix_t *)0x0;
  gap.open = 0;
  gap.extend = 0;
  do_sse41 = -0x80000000;
  do_sse2 = -0x80000000;
  bVar7 = true;
  bVar8 = true;
  bVar9 = true;
  bVar10 = true;
  bVar11 = true;
  bVar12 = true;
  bVar13 = true;
  seq_count = (unsigned_long)argv;
  argv_local._0_4_ = argc;
  while (iVar2 = getopt((int)argv_local,(char **)seq_count,"f:m:n:o:e:vSi:E"), iVar2 != -1) {
    switch(iVar2) {
    case 0x3f:
      if ((_optopt == 0x66) || (_optopt == 0x6e)) {
        fprintf(_stderr,"Option -%c requires an argument.\n",(ulong)_optopt);
      }
      else {
        ppuVar6 = __ctype_b_loc();
        if (((*ppuVar6)[(int)_optopt] & 0x4000) == 0) {
          fprintf(_stderr,"Unknown option character `\\x%x\'.\n",(ulong)_optopt);
        }
        else {
          fprintf(_stderr,"Unknown option `-%c\'.\n",(ulong)_optopt);
        }
      }
      exit(1);
    default:
      fprintf(_stderr,"default case in getopt\n");
      exit(1);
    case 0x45:
      exit_on_mismatch = 1;
      break;
    case 0x53:
      bVar1 = false;
      break;
    case 0x65:
      piVar3 = __errno_location();
      *piVar3 = 0;
      lVar4 = strtol((char *)_optarg,&filename,10);
      do_sse2 = (int)lVar4;
      piVar3 = __errno_location();
      if (*piVar3 != 0) {
        perror("strtol gap.extend");
        exit(1);
      }
      break;
    case 0x66:
      _test_scores = _optarg;
      break;
    case 0x69:
      pcVar5 = strstr((char *)_optarg,"sse2");
      bVar7 = pcVar5 == (char *)0x0;
      pcVar5 = strstr((char *)_optarg,"sse41");
      bVar8 = pcVar5 == (char *)0x0;
      pcVar5 = strstr((char *)_optarg,"avx2");
      bVar9 = pcVar5 == (char *)0x0;
      strstr((char *)_optarg,"altivec");
      strstr((char *)_optarg,"neon");
      pcVar5 = strstr((char *)_optarg,"disp");
      bVar10 = pcVar5 == (char *)0x0;
      pcVar5 = strstr((char *)_optarg,"nw");
      bVar11 = pcVar5 == (char *)0x0;
      pcVar5 = strstr((char *)_optarg,"sg");
      bVar12 = pcVar5 == (char *)0x0;
      pcVar5 = strstr((char *)_optarg,"sw");
      bVar13 = pcVar5 == (char *)0x0;
      break;
    case 0x6d:
      matrix = _optarg;
      break;
    case 0x6e:
      piVar3 = __errno_location();
      *piVar3 = 0;
      limit = strtol((char *)_optarg,&filename,10);
      piVar3 = __errno_location();
      if (*piVar3 != 0) {
        perror("strtol");
        exit(1);
      }
      break;
    case 0x6f:
      piVar3 = __errno_location();
      *piVar3 = 0;
      lVar4 = strtol((char *)_optarg,&filename,10);
      do_sse41 = (int)lVar4;
      piVar3 = __errno_location();
      if (*piVar3 != 0) {
        perror("strtol gap.open");
        exit(1);
      }
      break;
    case 0x76:
      verbose = 1;
    }
  }
  if (_test_scores == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"no filename specified\n");
    exit(1);
  }
  endptr = (char *)parasail_sequences_from_file(_test_scores);
  if (limit == 0) {
    limit = *(unsigned_long *)(endptr + 8);
  }
  if ((matrix != (parasail_matrix_t *)0x0) &&
     (gap = (gap_score_t)parasail_matrix_lookup(matrix), gap == (gap_score_t)0x0)) {
    fprintf(_stderr,"Specified substitution matrix not found.\n");
    exit(1);
  }
  sequences = (parasail_sequences_t *)binomial_coefficient(limit,2);
  printf("%lu choose 2 is %lu\n",limit,sequences);
  if (((bVar7) && (iVar2 = parasail_can_use_sse2(), iVar2 != 0)) && (bVar1)) {
    if (bVar11) {
      f.fs = parasail_nw_trace_sse2.fs;
      f.name = parasail_nw_trace_sse2.name;
      check_functions(f,(parasail_sequences_t *)endptr,(unsigned_long)sequences,
                      (parasail_matrix_t *)gap,_do_sse41);
    }
    if (bVar12) {
      f_00.fs = parasail_sg_trace_sse2.fs;
      f_00.name = parasail_sg_trace_sse2.name;
      check_functions(f_00,(parasail_sequences_t *)endptr,(unsigned_long)sequences,
                      (parasail_matrix_t *)gap,_do_sse41);
      f_01.fs = parasail_sg_qb_trace_sse2.fs;
      f_01.name = parasail_sg_qb_trace_sse2.name;
      check_functions(f_01,(parasail_sequences_t *)endptr,(unsigned_long)sequences,
                      (parasail_matrix_t *)gap,_do_sse41);
      f_02.fs = parasail_sg_qe_trace_sse2.fs;
      f_02.name = parasail_sg_qe_trace_sse2.name;
      check_functions(f_02,(parasail_sequences_t *)endptr,(unsigned_long)sequences,
                      (parasail_matrix_t *)gap,_do_sse41);
      f_03.fs = parasail_sg_qx_trace_sse2.fs;
      f_03.name = parasail_sg_qx_trace_sse2.name;
      check_functions(f_03,(parasail_sequences_t *)endptr,(unsigned_long)sequences,
                      (parasail_matrix_t *)gap,_do_sse41);
      f_04.fs = parasail_sg_db_trace_sse2.fs;
      f_04.name = parasail_sg_db_trace_sse2.name;
      check_functions(f_04,(parasail_sequences_t *)endptr,(unsigned_long)sequences,
                      (parasail_matrix_t *)gap,_do_sse41);
      f_05.fs = parasail_sg_de_trace_sse2.fs;
      f_05.name = parasail_sg_de_trace_sse2.name;
      check_functions(f_05,(parasail_sequences_t *)endptr,(unsigned_long)sequences,
                      (parasail_matrix_t *)gap,_do_sse41);
      f_06.fs = parasail_sg_dx_trace_sse2.fs;
      f_06.name = parasail_sg_dx_trace_sse2.name;
      check_functions(f_06,(parasail_sequences_t *)endptr,(unsigned_long)sequences,
                      (parasail_matrix_t *)gap,_do_sse41);
      f_07.fs = parasail_sg_qb_de_trace_sse2.fs;
      f_07.name = parasail_sg_qb_de_trace_sse2.name;
      check_functions(f_07,(parasail_sequences_t *)endptr,(unsigned_long)sequences,
                      (parasail_matrix_t *)gap,_do_sse41);
      f_08.fs = parasail_sg_qe_db_trace_sse2.fs;
      f_08.name = parasail_sg_qe_db_trace_sse2.name;
      check_functions(f_08,(parasail_sequences_t *)endptr,(unsigned_long)sequences,
                      (parasail_matrix_t *)gap,_do_sse41);
      f_09.fs = parasail_sg_qb_db_trace_sse2.fs;
      f_09.name = parasail_sg_qb_db_trace_sse2.name;
      check_functions(f_09,(parasail_sequences_t *)endptr,(unsigned_long)sequences,
                      (parasail_matrix_t *)gap,_do_sse41);
      f_10.fs = parasail_sg_qe_de_trace_sse2.fs;
      f_10.name = parasail_sg_qe_de_trace_sse2.name;
      check_functions(f_10,(parasail_sequences_t *)endptr,(unsigned_long)sequences,
                      (parasail_matrix_t *)gap,_do_sse41);
    }
    if (bVar13) {
      f_11.fs = parasail_sw_trace_sse2.fs;
      f_11.name = parasail_sw_trace_sse2.name;
      check_functions(f_11,(parasail_sequences_t *)endptr,(unsigned_long)sequences,
                      (parasail_matrix_t *)gap,_do_sse41);
    }
  }
  if (((bVar8) && (iVar2 = parasail_can_use_sse41(), iVar2 != 0)) && (bVar1)) {
    if (bVar11) {
      f_12.fs = parasail_nw_trace_sse41.fs;
      f_12.name = parasail_nw_trace_sse41.name;
      check_functions(f_12,(parasail_sequences_t *)endptr,(unsigned_long)sequences,
                      (parasail_matrix_t *)gap,_do_sse41);
    }
    if (bVar12) {
      f_13.fs = parasail_sg_trace_sse41.fs;
      f_13.name = parasail_sg_trace_sse41.name;
      check_functions(f_13,(parasail_sequences_t *)endptr,(unsigned_long)sequences,
                      (parasail_matrix_t *)gap,_do_sse41);
      f_14.fs = parasail_sg_qb_trace_sse41.fs;
      f_14.name = parasail_sg_qb_trace_sse41.name;
      check_functions(f_14,(parasail_sequences_t *)endptr,(unsigned_long)sequences,
                      (parasail_matrix_t *)gap,_do_sse41);
      f_15.fs = parasail_sg_qe_trace_sse41.fs;
      f_15.name = parasail_sg_qe_trace_sse41.name;
      check_functions(f_15,(parasail_sequences_t *)endptr,(unsigned_long)sequences,
                      (parasail_matrix_t *)gap,_do_sse41);
      f_16.fs = parasail_sg_qx_trace_sse41.fs;
      f_16.name = parasail_sg_qx_trace_sse41.name;
      check_functions(f_16,(parasail_sequences_t *)endptr,(unsigned_long)sequences,
                      (parasail_matrix_t *)gap,_do_sse41);
      f_17.fs = parasail_sg_db_trace_sse41.fs;
      f_17.name = parasail_sg_db_trace_sse41.name;
      check_functions(f_17,(parasail_sequences_t *)endptr,(unsigned_long)sequences,
                      (parasail_matrix_t *)gap,_do_sse41);
      f_18.fs = parasail_sg_de_trace_sse41.fs;
      f_18.name = parasail_sg_de_trace_sse41.name;
      check_functions(f_18,(parasail_sequences_t *)endptr,(unsigned_long)sequences,
                      (parasail_matrix_t *)gap,_do_sse41);
      f_19.fs = parasail_sg_dx_trace_sse41.fs;
      f_19.name = parasail_sg_dx_trace_sse41.name;
      check_functions(f_19,(parasail_sequences_t *)endptr,(unsigned_long)sequences,
                      (parasail_matrix_t *)gap,_do_sse41);
      f_20.fs = parasail_sg_qb_de_trace_sse41.fs;
      f_20.name = parasail_sg_qb_de_trace_sse41.name;
      check_functions(f_20,(parasail_sequences_t *)endptr,(unsigned_long)sequences,
                      (parasail_matrix_t *)gap,_do_sse41);
      f_21.fs = parasail_sg_qe_db_trace_sse41.fs;
      f_21.name = parasail_sg_qe_db_trace_sse41.name;
      check_functions(f_21,(parasail_sequences_t *)endptr,(unsigned_long)sequences,
                      (parasail_matrix_t *)gap,_do_sse41);
      f_22.fs = parasail_sg_qb_db_trace_sse41.fs;
      f_22.name = parasail_sg_qb_db_trace_sse41.name;
      check_functions(f_22,(parasail_sequences_t *)endptr,(unsigned_long)sequences,
                      (parasail_matrix_t *)gap,_do_sse41);
      f_23.fs = parasail_sg_qe_de_trace_sse41.fs;
      f_23.name = parasail_sg_qe_de_trace_sse41.name;
      check_functions(f_23,(parasail_sequences_t *)endptr,(unsigned_long)sequences,
                      (parasail_matrix_t *)gap,_do_sse41);
    }
    if (bVar13) {
      f_24.fs = parasail_sw_trace_sse41.fs;
      f_24.name = parasail_sw_trace_sse41.name;
      check_functions(f_24,(parasail_sequences_t *)endptr,(unsigned_long)sequences,
                      (parasail_matrix_t *)gap,_do_sse41);
    }
  }
  if (((bVar9) && (iVar2 = parasail_can_use_avx2(), iVar2 != 0)) && (bVar1)) {
    if (bVar11) {
      f_25.fs = parasail_nw_trace_avx2.fs;
      f_25.name = parasail_nw_trace_avx2.name;
      check_functions(f_25,(parasail_sequences_t *)endptr,(unsigned_long)sequences,
                      (parasail_matrix_t *)gap,_do_sse41);
    }
    if (bVar12) {
      f_26.fs = parasail_sg_trace_avx2.fs;
      f_26.name = parasail_sg_trace_avx2.name;
      check_functions(f_26,(parasail_sequences_t *)endptr,(unsigned_long)sequences,
                      (parasail_matrix_t *)gap,_do_sse41);
      f_27.fs = parasail_sg_qb_trace_avx2.fs;
      f_27.name = parasail_sg_qb_trace_avx2.name;
      check_functions(f_27,(parasail_sequences_t *)endptr,(unsigned_long)sequences,
                      (parasail_matrix_t *)gap,_do_sse41);
      f_28.fs = parasail_sg_qe_trace_avx2.fs;
      f_28.name = parasail_sg_qe_trace_avx2.name;
      check_functions(f_28,(parasail_sequences_t *)endptr,(unsigned_long)sequences,
                      (parasail_matrix_t *)gap,_do_sse41);
      f_29.fs = parasail_sg_qx_trace_avx2.fs;
      f_29.name = parasail_sg_qx_trace_avx2.name;
      check_functions(f_29,(parasail_sequences_t *)endptr,(unsigned_long)sequences,
                      (parasail_matrix_t *)gap,_do_sse41);
      f_30.fs = parasail_sg_db_trace_avx2.fs;
      f_30.name = parasail_sg_db_trace_avx2.name;
      check_functions(f_30,(parasail_sequences_t *)endptr,(unsigned_long)sequences,
                      (parasail_matrix_t *)gap,_do_sse41);
      f_31.fs = parasail_sg_de_trace_avx2.fs;
      f_31.name = parasail_sg_de_trace_avx2.name;
      check_functions(f_31,(parasail_sequences_t *)endptr,(unsigned_long)sequences,
                      (parasail_matrix_t *)gap,_do_sse41);
      f_32.fs = parasail_sg_dx_trace_avx2.fs;
      f_32.name = parasail_sg_dx_trace_avx2.name;
      check_functions(f_32,(parasail_sequences_t *)endptr,(unsigned_long)sequences,
                      (parasail_matrix_t *)gap,_do_sse41);
      f_33.fs = parasail_sg_qb_de_trace_avx2.fs;
      f_33.name = parasail_sg_qb_de_trace_avx2.name;
      check_functions(f_33,(parasail_sequences_t *)endptr,(unsigned_long)sequences,
                      (parasail_matrix_t *)gap,_do_sse41);
      f_34.fs = parasail_sg_qe_db_trace_avx2.fs;
      f_34.name = parasail_sg_qe_db_trace_avx2.name;
      check_functions(f_34,(parasail_sequences_t *)endptr,(unsigned_long)sequences,
                      (parasail_matrix_t *)gap,_do_sse41);
      f_35.fs = parasail_sg_qb_db_trace_avx2.fs;
      f_35.name = parasail_sg_qb_db_trace_avx2.name;
      check_functions(f_35,(parasail_sequences_t *)endptr,(unsigned_long)sequences,
                      (parasail_matrix_t *)gap,_do_sse41);
      f_36.fs = parasail_sg_qe_de_trace_avx2.fs;
      f_36.name = parasail_sg_qe_de_trace_avx2.name;
      check_functions(f_36,(parasail_sequences_t *)endptr,(unsigned_long)sequences,
                      (parasail_matrix_t *)gap,_do_sse41);
    }
    if (bVar13) {
      f_37.fs = parasail_sw_trace_avx2.fs;
      f_37.name = parasail_sw_trace_avx2.name;
      check_functions(f_37,(parasail_sequences_t *)endptr,(unsigned_long)sequences,
                      (parasail_matrix_t *)gap,_do_sse41);
    }
  }
  if ((bVar10) && (bVar1)) {
    if (bVar11) {
      f_38.fs = parasail_nw_trace_disp.fs;
      f_38.name = parasail_nw_trace_disp.name;
      check_functions(f_38,(parasail_sequences_t *)endptr,(unsigned_long)sequences,
                      (parasail_matrix_t *)gap,_do_sse41);
    }
    if (bVar12) {
      f_39.fs = parasail_sg_trace_disp.fs;
      f_39.name = parasail_sg_trace_disp.name;
      check_functions(f_39,(parasail_sequences_t *)endptr,(unsigned_long)sequences,
                      (parasail_matrix_t *)gap,_do_sse41);
      f_40.fs = parasail_sg_qb_trace_disp.fs;
      f_40.name = parasail_sg_qb_trace_disp.name;
      check_functions(f_40,(parasail_sequences_t *)endptr,(unsigned_long)sequences,
                      (parasail_matrix_t *)gap,_do_sse41);
      f_41.fs = parasail_sg_qe_trace_disp.fs;
      f_41.name = parasail_sg_qe_trace_disp.name;
      check_functions(f_41,(parasail_sequences_t *)endptr,(unsigned_long)sequences,
                      (parasail_matrix_t *)gap,_do_sse41);
      f_42.fs = parasail_sg_qx_trace_disp.fs;
      f_42.name = parasail_sg_qx_trace_disp.name;
      check_functions(f_42,(parasail_sequences_t *)endptr,(unsigned_long)sequences,
                      (parasail_matrix_t *)gap,_do_sse41);
      f_43.fs = parasail_sg_db_trace_disp.fs;
      f_43.name = parasail_sg_db_trace_disp.name;
      check_functions(f_43,(parasail_sequences_t *)endptr,(unsigned_long)sequences,
                      (parasail_matrix_t *)gap,_do_sse41);
      f_44.fs = parasail_sg_de_trace_disp.fs;
      f_44.name = parasail_sg_de_trace_disp.name;
      check_functions(f_44,(parasail_sequences_t *)endptr,(unsigned_long)sequences,
                      (parasail_matrix_t *)gap,_do_sse41);
      f_45.fs = parasail_sg_dx_trace_disp.fs;
      f_45.name = parasail_sg_dx_trace_disp.name;
      check_functions(f_45,(parasail_sequences_t *)endptr,(unsigned_long)sequences,
                      (parasail_matrix_t *)gap,_do_sse41);
      f_46.fs = parasail_sg_qb_de_trace_disp.fs;
      f_46.name = parasail_sg_qb_de_trace_disp.name;
      check_functions(f_46,(parasail_sequences_t *)endptr,(unsigned_long)sequences,
                      (parasail_matrix_t *)gap,_do_sse41);
      f_47.fs = parasail_sg_qe_db_trace_disp.fs;
      f_47.name = parasail_sg_qe_db_trace_disp.name;
      check_functions(f_47,(parasail_sequences_t *)endptr,(unsigned_long)sequences,
                      (parasail_matrix_t *)gap,_do_sse41);
      f_48.fs = parasail_sg_qb_db_trace_disp.fs;
      f_48.name = parasail_sg_qb_db_trace_disp.name;
      check_functions(f_48,(parasail_sequences_t *)endptr,(unsigned_long)sequences,
                      (parasail_matrix_t *)gap,_do_sse41);
      f_49.fs = parasail_sg_qe_de_trace_disp.fs;
      f_49.name = parasail_sg_qe_de_trace_disp.name;
      check_functions(f_49,(parasail_sequences_t *)endptr,(unsigned_long)sequences,
                      (parasail_matrix_t *)gap,_do_sse41);
    }
    if (bVar13) {
      f_50.fs = parasail_sw_trace_disp.fs;
      f_50.name = parasail_sw_trace_disp.name;
      check_functions(f_50,(parasail_sequences_t *)endptr,(unsigned_long)sequences,
                      (parasail_matrix_t *)gap,_do_sse41);
    }
  }
  parasail_sequences_free(endptr);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
    unsigned long seq_count = 0;
    unsigned long limit = 0;
    parasail_sequences_t *sequences = NULL;
    char *endptr = NULL;
    char *filename = NULL;
    int c = 0;
    int test_scores = 1;
    char *matrixname = NULL;
    const parasail_matrix_t *matrix = NULL;
    gap_score_t gap = {INT_MIN,INT_MIN};
    int do_sse2 = 1;
    int do_sse41 = 1;
    int do_avx2 = 1;
    int do_altivec = 1;
    int do_neon = 1;
    int do_disp = 1;
    int do_nw = 1;
    int do_sg = 1;
    int do_sw = 1;

    while ((c = getopt(argc, argv, "f:m:n:o:e:vSi:E")) != -1) {
        switch (c) {
            case 'f':
                filename = optarg;
                break;
            case 'm':
                matrixname = optarg;
                break;
            case 'n':
                errno = 0;
                seq_count = strtol(optarg, &endptr, 10);
                if (errno) {
                    perror("strtol");
                    exit(1);
                }
                break;
            case 'o':
                errno = 0;
                gap.open = strtol(optarg, &endptr, 10);
                if (errno) {
                    perror("strtol gap.open");
                    exit(1);
                }
                break;
            case 'e':
                errno = 0;
                gap.extend = strtol(optarg, &endptr, 10);
                if (errno) {
                    perror("strtol gap.extend");
                    exit(1);
                }
                break;
            case 'v':
                verbose = 1;
                break;
            case 'E':
                exit_on_mismatch = 1;
                break;
            case 'S':
                test_scores = 0;
                break;
            case 'i':
                do_sse2 = (NULL == strstr(optarg, "sse2"));
                do_sse41 = (NULL == strstr(optarg, "sse41"));
                do_avx2 = (NULL == strstr(optarg, "avx2"));
                do_altivec = (NULL == strstr(optarg, "altivec"));
                do_neon = (NULL == strstr(optarg, "neon"));
                do_disp = (NULL == strstr(optarg, "disp"));
                do_nw = (NULL == strstr(optarg, "nw"));
                do_sg = (NULL == strstr(optarg, "sg"));
                do_sw = (NULL == strstr(optarg, "sw"));
                break;
            case '?':
                if (optopt == 'f' || optopt == 'n') {
                    fprintf(stderr,
                            "Option -%c requires an argument.\n",
                            optopt);
                }
                else if (isprint(optopt)) {
                    fprintf(stderr, "Unknown option `-%c'.\n",
                            optopt);
                }
                else {
                    fprintf(stderr,
                            "Unknown option character `\\x%x'.\n",
                            optopt);
                }
                exit(1);
            default:
                fprintf(stderr, "default case in getopt\n");
                exit(1);
        }
    }

    if (filename) {
        sequences = parasail_sequences_from_file(filename);
        if (0 == seq_count) {
            seq_count = sequences->l;
        }
    }
    else {
        fprintf(stderr, "no filename specified\n");
        exit(1);
    }

    /* select the matrix */
    if (matrixname) {
        matrix = parasail_matrix_lookup(matrixname);
        if (NULL == matrix) {
            fprintf(stderr, "Specified substitution matrix not found.\n");
            exit(1);
        }
    }

    limit = binomial_coefficient(seq_count, 2);
    printf("%lu choose 2 is %lu\n", seq_count, limit);

#if HAVE_SSE2
    if (do_sse2 && parasail_can_use_sse2()) {
        if (test_scores) {
            if (do_nw) check_functions(parasail_nw_trace_sse2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_trace_sse2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qb_trace_sse2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qe_trace_sse2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qx_trace_sse2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_db_trace_sse2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_de_trace_sse2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_dx_trace_sse2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qb_de_trace_sse2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qe_db_trace_sse2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qb_db_trace_sse2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qe_de_trace_sse2, sequences, limit, matrix, gap);
            if (do_sw) check_functions(parasail_sw_trace_sse2, sequences, limit, matrix, gap);
        }
    }
#endif

#if HAVE_SSE41
    if (do_sse41 && parasail_can_use_sse41()) {
        if (test_scores) {
            if (do_nw) check_functions(parasail_nw_trace_sse41, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_trace_sse41, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qb_trace_sse41, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qe_trace_sse41, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qx_trace_sse41, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_db_trace_sse41, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_de_trace_sse41, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_dx_trace_sse41, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qb_de_trace_sse41, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qe_db_trace_sse41, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qb_db_trace_sse41, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qe_de_trace_sse41, sequences, limit, matrix, gap);
            if (do_sw) check_functions(parasail_sw_trace_sse41, sequences, limit, matrix, gap);
        }
    }
#endif

#if HAVE_AVX2
    if (do_avx2 && parasail_can_use_avx2()) {
        if (test_scores) {
            if (do_nw) check_functions(parasail_nw_trace_avx2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_trace_avx2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qb_trace_avx2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qe_trace_avx2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qx_trace_avx2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_db_trace_avx2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_de_trace_avx2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_dx_trace_avx2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qb_de_trace_avx2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qe_db_trace_avx2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qb_db_trace_avx2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qe_de_trace_avx2, sequences, limit, matrix, gap);
            if (do_sw) check_functions(parasail_sw_trace_avx2, sequences, limit, matrix, gap);
        }
    }
#endif

#if HAVE_ALTIVEC
    if (do_altivec && parasail_can_use_altivec()) {
        if (test_scores) {
            if (do_nw) check_functions(parasail_nw_trace_altivec, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_trace_altivec, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qb_trace_altivec, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qe_trace_altivec, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qx_trace_altivec, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_db_trace_altivec, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_de_trace_altivec, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_dx_trace_altivec, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qb_de_trace_altivec, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qe_db_trace_altivec, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qb_db_trace_altivec, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qe_de_trace_altivec, sequences, limit, matrix, gap);
            if (do_sw) check_functions(parasail_sw_trace_altivec, sequences, limit, matrix, gap);
        }
    }
#endif

#if HAVE_NEON
    if (do_neon && parasail_can_use_neon()) {
        if (test_scores) {
            if (do_nw) check_functions(parasail_nw_trace_neon, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_trace_neon, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qb_trace_neon, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qe_trace_neon, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qx_trace_neon, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_db_trace_neon, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_de_trace_neon, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_dx_trace_neon, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qb_de_trace_neon, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qe_db_trace_neon, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qb_db_trace_neon, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qe_de_trace_neon, sequences, limit, matrix, gap);
            if (do_sw) check_functions(parasail_sw_trace_neon, sequences, limit, matrix, gap);
        }
    }
#endif

    if (do_disp) {
        if (test_scores) {
            if (do_nw) check_functions(parasail_nw_trace_disp, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_trace_disp, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qb_trace_disp, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qe_trace_disp, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qx_trace_disp, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_db_trace_disp, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_de_trace_disp, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_dx_trace_disp, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qb_de_trace_disp, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qe_db_trace_disp, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qb_db_trace_disp, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qe_de_trace_disp, sequences, limit, matrix, gap);
            if (do_sw) check_functions(parasail_sw_trace_disp, sequences, limit, matrix, gap);
        }
    }

    parasail_sequences_free(sequences);

    return 0;
}